

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messages.cpp
# Opt level: O0

void hedg::stream::authenticate_msg(streambuf *request,stream_authenticate *p)

{
  ostream *poVar1;
  ostream local_128 [8];
  ostream request_stream;
  stream_authenticate *p_local;
  streambuf *request_local;
  
  std::ostream::ostream(local_128,&request->super_streambuf);
  poVar1 = std::operator<<(local_128,"{\"op\":\"authentication\",\"id\":1,\"appKey\":\"");
  poVar1 = std::operator<<(poVar1,(string *)config::app_key_abi_cxx11_);
  poVar1 = std::operator<<(poVar1,"\",\"session\":\"");
  poVar1 = std::operator<<(poVar1,(string *)p);
  std::operator<<(poVar1,"\"}");
  std::operator<<(local_128,"\r\n");
  std::ostream::~ostream(local_128);
  return;
}

Assistant:

void authenticate_msg(boost::asio::streambuf& request, params::stream_authenticate p) {
		std::ostream request_stream(&request);
		request_stream << "{\"op\":\"authentication\",\"id\":1,\"appKey\":\"" << config::app_key << "\","
			"\"session\":\"" << p.session_id << "\"}";
		request_stream << "\r\n";
	}